

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O1

bool __thiscall AllDiffBoundsImp<0>::filterlower(AllDiffBoundsImp<0> *this)

{
  interval *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  interval *piVar9;
  IntVar *pIVar10;
  bool bVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int l_1;
  long lVar16;
  int l;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int iVar21;
  long lVar22;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  int iVar23;
  bool bVar24;
  int local_90;
  anon_union_8_2_743a5d44_for_Reason_0 local_78;
  int local_70;
  int local_6c;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  ulong uVar20;
  
  if (-1 < this->nb) {
    piVar4 = this->bounds;
    piVar5 = this->t;
    piVar6 = this->h;
    piVar7 = this->d;
    piVar8 = this->bucket;
    lVar22 = 0;
    do {
      iVar2 = piVar4[lVar22 + 1];
      piVar6[lVar22 + 1] = (int)lVar22;
      piVar5[lVar22 + 1] = (int)lVar22;
      piVar7[lVar22 + 1] = iVar2 - piVar4[lVar22];
      piVar8[lVar22 + 1] = -1;
      lVar22 = lVar22 + 1;
    } while (lVar22 <= this->nb);
  }
  if (0 < this->sz) {
    lVar22 = 0;
    bVar24 = true;
    do {
      piVar9 = this->iv;
      piVar4 = this->maxsorted;
      piVar1 = piVar9 + piVar4[lVar22];
      local_70 = piVar1->minrank;
      iVar2 = piVar1->maxrank;
      local_58 = (long)iVar2;
      piVar5 = this->t;
      iVar18 = local_70 + 1;
      iVar3 = iVar18;
      do {
        local_90 = iVar3;
        iVar3 = piVar5[local_90];
      } while (local_90 < iVar3);
      piVar6 = this->bucket;
      piVar1->next = piVar6[local_90];
      piVar6[local_90] = piVar4[lVar22];
      piVar4 = this->d + local_90;
      *piVar4 = *piVar4 + -1;
      if (*piVar4 == 0) {
        piVar5[local_90] = local_90 + 1;
        iVar21 = local_90 + 1;
        do {
          local_90 = iVar21;
          iVar21 = piVar5[local_90];
        } while (local_90 < piVar5[local_90]);
        piVar5[local_90] = iVar3;
      }
      while (iVar18 != local_90) {
        iVar21 = piVar5[iVar18];
        piVar5[iVar18] = local_90;
        iVar18 = iVar21;
      }
      iVar18 = this->h[local_70];
      if (local_70 < iVar18) {
        piVar4 = this->bounds;
        do {
          iVar21 = iVar18;
          lVar17 = (long)iVar21;
          iVar18 = this->h[lVar17];
        } while (iVar21 < iVar18);
        iVar18 = piVar4[lVar17];
        if (so.lazy == true) {
          iVar15 = piVar4[local_70];
          lVar16 = lVar17;
          if (iVar15 < piVar4[lVar17]) {
            do {
              uVar13 = piVar6[lVar16];
              while (-1 < (int)uVar13) {
                uVar19 = (ulong)uVar13;
                uVar20 = (ulong)uVar13;
                uVar13 = piVar9[uVar19].next;
                if (piVar9[uVar20].min < iVar15) {
                  iVar15 = piVar9[uVar20].min;
                }
              }
              lVar12 = lVar16 + -1;
              lVar16 = lVar16 + -1;
            } while (iVar15 < piVar4[lVar12]);
          }
          local_68 = (long)iVar18;
          local_78._pt = (Clause *)malloc((long)((iVar18 - iVar15) * 2) * 4 + 0x14);
          *(uint *)local_78._pt = (*(uint *)local_78._pt & 0xfc) + (iVar18 - iVar15) * 0x200 + 0x302
          ;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_78._pt);
          r = local_78;
          local_40 = (long)iVar15;
          pIVar10 = this->x[this->maxsorted[lVar22]].var;
          uVar13 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xd])(pIVar10,local_40,2);
          if (*(uint *)r._pt < 0x200) goto LAB_00157e42;
          *(uint *)(r._a + 8) = uVar13 ^ 1;
          lVar16 = local_68;
          if (iVar15 < this->bounds[iVar21]) {
            local_48 = local_68 + -1;
            iVar23 = 3;
            local_6c = iVar15;
            local_60 = lVar22;
            do {
              uVar13 = this->bucket[lVar17];
              local_50 = lVar17;
              if (-1 < (int)uVar13) {
                lVar22 = (long)iVar23 + 1;
                do {
                  local_38 = lVar22 + -1;
                  pIVar10 = this->x[uVar13].var;
                  uVar14 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xd])
                                     (pIVar10,local_40,2);
                  if ((long)(ulong)(*(uint *)r._pt >> 8) <= local_38) goto LAB_00157e42;
                  (r._pt)->data[lVar22 + -1].x = uVar14 ^ 1;
                  pIVar10 = this->x[uVar13].var;
                  uVar14 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xd])
                                     (pIVar10,local_48,3);
                  if ((long)(ulong)(*(uint *)r._pt >> 8) <= lVar22) goto LAB_00157e42;
                  (r._pt)->data[lVar22].x = uVar14 ^ 1;
                  uVar13 = this->iv[uVar13].next;
                  lVar22 = lVar22 + 2;
                  iVar23 = iVar23 + 2;
                } while (-1 < (int)uVar13);
              }
              lVar17 = local_50 + -1;
              lVar22 = local_60;
              lVar16 = local_68;
            } while (local_6c < this->bounds[local_50 + -1]);
          }
        }
        else {
          r._pt = (Clause *)0x0;
          lVar16 = (long)iVar18;
        }
        uVar13 = (this->b).v;
        if (sat.assigns.data[uVar13] == 0) {
          pIVar10 = this->x[this->maxsorted[lVar22]].var;
          bVar11 = true;
          if ((pIVar10->max).v < iVar18) {
            iVar18 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xd])(pIVar10,lVar16,2);
            if (*(uint *)r < 0x300) goto LAB_00157e42;
            *(int *)((long)r + 0xc) = iVar18;
            SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),(Reason)r);
            bVar24 = sat.confl == (Clause *)0x0;
LAB_00157dc7:
            bVar11 = false;
          }
        }
        else {
          if (*(uint *)r < 0x300) {
LAB_00157e42:
            abort();
          }
          *(uint *)((long)r + 0xc) = (uint)((byte)sat.assigns.data[uVar13] < 0xfe) + uVar13 * 2;
          pIVar10 = this->x[this->maxsorted[lVar22]].var;
          iVar15 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xe])(pIVar10,lVar16,r,1);
          if ((char)iVar15 == '\0') {
            bVar24 = false;
            goto LAB_00157dc7;
          }
          piVar4 = this->maxsorted;
          this->iv[piVar4[lVar22]].min = iVar18;
          if ((iVar18 < ((this->x[piVar4[lVar22]].var)->min).v) &&
             ((this->super_Propagator).in_queue == false)) {
            (this->super_Propagator).in_queue = true;
            local_78 = (anon_union_8_2_743a5d44_for_Reason_0)this;
            vec<Propagator_*>::push
                      (engine.p_queue.data + (uint)(this->super_Propagator).priority,
                       (Propagator **)&local_78._pt);
          }
          bVar11 = true;
          if (local_70 != iVar21) {
            piVar4 = this->h;
            do {
              iVar18 = piVar4[local_70];
              piVar4[local_70] = iVar21;
              local_70 = iVar18;
            } while (iVar18 != iVar21);
          }
        }
        if (bVar11) goto LAB_00157dd5;
        bVar11 = false;
      }
      else {
LAB_00157dd5:
        bVar11 = true;
        if (this->d[local_90] == this->bounds[local_90] - this->bounds[local_58]) {
          piVar4 = this->h;
          iVar18 = piVar4[local_58];
          while (iVar18 != iVar3 + -1) {
            iVar21 = piVar4[iVar18];
            piVar4[iVar18] = iVar2;
            iVar18 = iVar21;
          }
          piVar4[local_58] = iVar3 + -1;
        }
      }
      if (!bVar11) {
        return bVar24;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < this->sz);
  }
  return true;
}

Assistant:

bool filterlower() {
		int i;
		int j;
		int w;
		int z;

		// fprintf(stderr, "AllDiffBounds::filterlower()\n");
		for (i = 1; i <= nb + 1; i++) {
			d[i] = bounds[i] - bounds[t[i] = h[i] = i - 1];
			bucket[i] = -1;  // this could perhaps be avoided
		}
		for (i = 0; i < sz; i++) {  // visit intervals in increasing max order
			const int minrank = iv[maxsorted[i]].minrank;
			const int maxrank = iv[maxsorted[i]].maxrank;
			// fprintf(stderr, "var %d [%d, %d)\n", maxsorted[i], bounds[minrank], bounds[maxrank]);
			j = t[z = pathmax(t, minrank + 1)];
			iv[maxsorted[i]].next = bucket[z];
			bucket[z] = maxsorted[i];
			if (--d[z] == 0) {
				t[z = pathmax(t, t[z] = z + 1)] = j;
			}
			pathset(t, minrank + 1, z, z);  // path compression
			// if (d[z] < bounds[z]-bounds[maxrank]) return false; // no solution
			if (h[minrank] > minrank) {
				Clause* r = nullptr;
				const int hall_max = bounds[w = pathmax(h, h[minrank])];
				if (so.lazy) {
					int hall_min = bounds[minrank];
					// here both k and hall_min are decreasing, stop when k catches up
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							hall_min = std::min(hall_min, iv[l].min);
						}
					}
					// fprintf(stderr, "  in hall [%d, %d):\n", hall_min, hall_max);
					r = Reason_new(3 + (hall_max - hall_min) * 2);
					(*r)[1] = ~x[maxsorted[i]].getLit(hall_min, LR_GE);
					int m = 3;
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							// fprintf(stderr, "    var %d [%d, %d)\n", l, iv[l].min, iv[l].max);
							(*r)[m++] = ~x[l].getLit(hall_min, LR_GE);
							(*r)[m++] = ~x[l].getLit(hall_max - 1, LR_LE);
						}
					}
					assert(m == 3 + (hall_max - hall_min) * 2);
				}
				if (b.isFixed()) {
					assert(b.isTrue());
					(*r)[2] = b.getValLit();
					if (!x[maxsorted[i]].setMin(hall_max, r)) {
						// fprintf(stderr, "  failure\n");
						return false;
					}
					iv[maxsorted[i]].min = hall_max;
					if (x[maxsorted[i]].getMin() > hall_max) {
						// fprintf(stderr, "  hole, var %d [%d, %d)\n", maxsorted[i],
						// static_cast<int>(x[maxsorted[i]].getMin()), iv[maxsorted[i]].max);
						pushInQueue();  // hole in domain
					}
					pathset(h, minrank, w, w);  // path compression
				} else {
					if (x[maxsorted[i]].getMax() < hall_max) {
						(*r)[2] = x[maxsorted[i]].getLit(hall_max, LR_GE);
						return b.setVal(false, r);
					}
				}
			}
			if (d[z] == bounds[z] - bounds[maxrank]) {
				// fprintf(stderr, "  new hall [%d, %d)\n", bounds[j], bounds[maxrank]);
				pathset(h, h[maxrank], j - 1, maxrank);  // mark hall interval
				h[maxrank] = j - 1;
			}
		}
		return true;
	}